

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

void __thiscall CLI::Option::_reduce_results(Option *this,results_t *res,results_t *original)

{
  byte bVar1;
  type_conflict tVar2;
  ulong uVar3;
  ulong uVar4;
  ArgumentMismatch *pAVar5;
  string *delim;
  pointer pbVar6;
  int iVar7;
  pointer pbVar8;
  int num;
  int t;
  string local_a8;
  undefined1 local_88 [32];
  string local_68;
  string local_48;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(res,(res->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start);
  switch((this->super_OptionBase<CLI::Option>).multi_option_policy_) {
  case TakeLast:
    local_a8._M_dataplus._M_p._0_4_ = this->type_size_max_;
    tVar2 = detail::checked_multiply<int>((int *)&local_a8,this->expected_max_);
    uVar4 = 1;
    if (1 < (int)(uint)local_a8._M_dataplus._M_p) {
      uVar4 = (ulong)(uint)local_a8._M_dataplus._M_p;
    }
    uVar3 = 0x20000000;
    if (tVar2) {
      uVar3 = uVar4;
    }
    pbVar6 = (original->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)pbVar6 -
                (long)(original->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar3) {
      return;
    }
    pbVar8 = pbVar6 + -uVar3;
    goto LAB_00117468;
  case TakeFirst:
    local_a8._M_dataplus._M_p._0_4_ = this->type_size_max_;
    tVar2 = detail::checked_multiply<int>((int *)&local_a8,this->expected_max_);
    uVar4 = 1;
    if (1 < (int)(uint)local_a8._M_dataplus._M_p) {
      uVar4 = (ulong)(uint)local_a8._M_dataplus._M_p;
    }
    uVar3 = 0x20000000;
    if (tVar2) {
      uVar3 = uVar4;
    }
    pbVar8 = (original->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(original->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <= uVar3) {
      return;
    }
    pbVar6 = pbVar8 + uVar3;
LAB_00117468:
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_assign_aux<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)res,pbVar8,
               pbVar6);
    break;
  case Join:
    if (0x20 < (ulong)((long)(this->results_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->results_).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      bVar1 = (this->super_OptionBase<CLI::Option>).delimiter_;
      delim = (string *)0xa;
      if (bVar1 != 0) {
        delim = (string *)(ulong)bVar1;
      }
      local_88._0_8_ = (pointer)(local_88 + 0x10);
      ::std::__cxx11::string::_M_construct((ulong)local_88,'\x01');
      detail::join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&local_a8,(detail *)original,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_88,delim);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)res,&local_a8)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,(uint)local_a8._M_dataplus._M_p) !=
          &local_a8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_a8._M_dataplus._M_p._4_4_,(uint)local_a8._M_dataplus._M_p),
                        local_a8.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_88._0_8_ != (pointer)(local_88 + 0x10)) {
        operator_delete((void *)local_88._0_8_,
                        (ulong)((long)&((_Alloc_hider *)local_88._16_8_)->_M_p + 1));
      }
    }
    break;
  case TakeAll:
    break;
  default:
    iVar7 = this->expected_min_ * this->type_size_min_;
    local_a8._M_dataplus._M_p._0_4_ = this->type_size_max_;
    tVar2 = detail::checked_multiply<int>((int *)&local_a8,this->expected_max_);
    iVar7 = iVar7 + (uint)(iVar7 == 0);
    num = 0x20000000;
    if (tVar2) {
      num = (uint)local_a8._M_dataplus._M_p + ((uint)local_a8._M_dataplus._M_p == 0);
    }
    uVar4 = (long)(original->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(original->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 5;
    if (uVar4 < (ulong)(long)iVar7) {
      pAVar5 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
      get_name_abi_cxx11_(&local_48,this,false,false);
      ArgumentMismatch::AtLeast
                (pAVar5,&local_48,iVar7,
                 (long)(original->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(original->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 5);
      __cxa_throw(pAVar5,&ArgumentMismatch::typeinfo,Error::~Error);
    }
    if ((ulong)(long)num < uVar4) {
      pAVar5 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
      get_name_abi_cxx11_(&local_68,this,false,false);
      ArgumentMismatch::AtMost
                (pAVar5,&local_68,num,
                 (long)(original->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(original->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 5);
      __cxa_throw(pAVar5,&ArgumentMismatch::typeinfo,Error::~Error);
    }
  }
  return;
}

Assistant:

void _reduce_results(results_t &res, const results_t &original) const {

        // max num items expected or length of vector, always at least 1
        // Only valid for a trimming policy

        res.clear();
        // Operation depends on the policy setting
        switch(multi_option_policy_) {
        case MultiOptionPolicy::TakeAll:
            break;
        case MultiOptionPolicy::TakeLast: {
            // Allow multi-option sizes (including 0)
            std::size_t trim_size = std::min<std::size_t>(
                static_cast<std::size_t>(std::max<int>(get_items_expected_max(), 1)), original.size());
            if(original.size() != trim_size) {
                res.assign(original.end() - static_cast<results_t::difference_type>(trim_size), original.end());
            }
        } break;
        case MultiOptionPolicy::TakeFirst: {
            std::size_t trim_size = std::min<std::size_t>(
                static_cast<std::size_t>(std::max<int>(get_items_expected_max(), 1)), original.size());
            if(original.size() != trim_size) {
                res.assign(original.begin(), original.begin() + static_cast<results_t::difference_type>(trim_size));
            }
        } break;
        case MultiOptionPolicy::Join:
            if(results_.size() > 1) {
                res.push_back(detail::join(original, std::string(1, (delimiter_ == '\0') ? '\n' : delimiter_)));
            }
            break;
        case MultiOptionPolicy::Throw:
        default: {
            auto num_min = static_cast<std::size_t>(get_items_expected_min());
            auto num_max = static_cast<std::size_t>(get_items_expected_max());
            if(num_min == 0) {
                num_min = 1;
            }
            if(num_max == 0) {
                num_max = 1;
            }
            if(original.size() < num_min) {
                throw ArgumentMismatch::AtLeast(get_name(), static_cast<int>(num_min), original.size());
            }
            if(original.size() > num_max) {
                throw ArgumentMismatch::AtMost(get_name(), static_cast<int>(num_max), original.size());
            }
            break;
        }
        }
    }